

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall
embree::HairMaterial::HairMaterial(HairMaterial *this,Vec3fa *Kr,Vec3fa *Kt,float nx,float ny)

{
  undefined8 uVar1;
  allocator local_49;
  float local_48;
  float local_44;
  string local_40;
  
  local_48 = nx;
  local_44 = ny;
  std::__cxx11::string::string((string *)&local_40,"",&local_49);
  SceneGraph::MaterialNode::MaterialNode(&this->super_MaterialNode,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002a9e60;
  (this->base).type = 9;
  uVar1 = *(undefined8 *)((long)&Kr->field_0 + 8);
  *(undefined8 *)&(this->Kr).field_0 = *(undefined8 *)&Kr->field_0;
  *(undefined8 *)((long)&(this->Kr).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&Kt->field_0 + 8);
  *(undefined8 *)&(this->Kt).field_0 = *(undefined8 *)&Kt->field_0;
  *(undefined8 *)((long)&(this->Kt).field_0 + 8) = uVar1;
  this->nx = local_48;
  this->ny = local_44;
  return;
}

Assistant:

HairMaterial (const Vec3fa& Kr, const Vec3fa& Kt, float nx, float ny)
      : base(MATERIAL_HAIR), Kr(Kr), Kt(Kt), nx(nx), ny(ny) {}